

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::destroy_node(xml_node_struct *n,xml_allocator *alloc)

{
  ulong uVar1;
  xml_attribute_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *next_1;
  xml_node_struct *child;
  xml_attribute_struct *next;
  xml_attribute_struct *attr;
  uintptr_t header;
  xml_allocator *alloc_local;
  xml_node_struct *n_local;
  
  uVar1 = n->header;
  if ((uVar1 & 0x10) != 0) {
    xml_allocator::deallocate_string(alloc,n->name);
  }
  if ((uVar1 & 8) != 0) {
    xml_allocator::deallocate_string(alloc,n->value);
  }
  next = n->first_attribute;
  while (next != (xml_attribute_struct *)0x0) {
    pxVar2 = next->next_attribute;
    destroy_attribute(next,alloc);
    next = pxVar2;
  }
  next_1 = n->first_child;
  while (next_1 != (xml_node_struct *)0x0) {
    pxVar3 = next_1->next_sibling;
    destroy_node(next_1,alloc);
    next_1 = pxVar3;
  }
  xml_allocator::deallocate_memory(alloc,n,0x40,(xml_memory_page *)(uVar1 & 0xffffffffffffffe0));
  return;
}

Assistant:

inline void destroy_node(xml_node_struct* n, xml_allocator& alloc)
	{
		uintptr_t header = n->header;

		if (header & impl::xml_memory_page_name_allocated_mask) alloc.deallocate_string(n->name);
		if (header & impl::xml_memory_page_value_allocated_mask) alloc.deallocate_string(n->value);

		for (xml_attribute_struct* attr = n->first_attribute; attr; )
		{
			xml_attribute_struct* next = attr->next_attribute;

			destroy_attribute(attr, alloc);

			attr = next;
		}

		for (xml_node_struct* child = n->first_child; child; )
		{
			xml_node_struct* next = child->next_sibling;

			destroy_node(child, alloc);

			child = next;
		}

		alloc.deallocate_memory(n, sizeof(xml_node_struct), reinterpret_cast<xml_memory_page*>(header & xml_memory_page_pointer_mask));
	}